

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O2

string * StringBuilder<char[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
                   (string *__return_storage_ptr__,char (*arg) [2],unsigned_long *args,
                   char (*args_1) [2],char *args_2,char (*args_3) [2])

{
  string sStack_68;
  string local_48;
  
  StringBuilder_abi_cxx11_(&local_48,*arg);
  StringBuilder<unsigned_long,char_const(&)[2],char&,char_const(&)[2]>
            (&sStack_68,args,args_1,args_2,args_3);
  std::operator+(__return_storage_ptr__,&local_48,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}